

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>>::Visitor,0ul>
               (tuple<Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_> *message,uint tag,
               Visitor *visitor)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>_> *field;
  int dummy [2];
  int index;
  Visitor *visitor_local;
  uint tag_local;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
  *message_local;
  
  dummy[0] = -1;
  unique0x100000ac = visitor;
  field = meta::get<0ul,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>>(message);
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>>::Visitor>
            (tag,field,stack0xffffffffffffffd8,dummy);
  if (dummy[0] != -1) {
    std::bitset<1UL>::set
              ((bitset<1UL> *)
               &message[1].base.
                super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_false>
                .value.m_view.second,(long)dummy[0],true);
  }
  return dummy[0] != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }